

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O3

mz_bool mz_zip_reader_is_file_a_directory(mz_zip_archive *pZip,mz_uint file_index)

{
  uint uVar1;
  mz_zip_internal_state *pmVar2;
  void *pvVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  if (pZip != (mz_zip_archive *)0x0) {
    pmVar2 = pZip->m_pState;
    if (((pmVar2 == (mz_zip_internal_state *)0x0) || (pZip->m_total_files <= file_index)) ||
       (pvVar3 = (pmVar2->m_central_dir).m_p, pvVar3 == (void *)0x0)) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      return 0;
    }
    uVar1 = *(uint *)((long)(pmVar2->m_central_dir_offsets).m_p + (ulong)file_index * 4);
    uVar5 = (ulong)*(ushort *)((long)pvVar3 + (ulong)uVar1 + 0x1c);
    if ((uVar5 == 0) || (uVar4 = 1, *(char *)((long)pvVar3 + uVar5 + (ulong)uVar1 + 0x2d) != '/')) {
      uVar4 = *(uint *)((long)pvVar3 + (ulong)uVar1 + 0x26) >> 4 & 1;
    }
  }
  return uVar4;
}

Assistant:

mz_bool mz_zip_reader_is_file_a_directory(mz_zip_archive *pZip, mz_uint file_index)
{
    mz_uint filename_len, attribute_mapping_id, external_attr;
    const mz_uint8 *p = mz_zip_get_cdh(pZip, file_index);
    if (!p)
    {
        mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
        return MZ_FALSE;
    }

    filename_len = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    if (filename_len)
    {
        if (*(p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_len - 1) == '/')
            return MZ_TRUE;
    }

    /* Bugfix: This code was also checking if the internal attribute was non-zero, which wasn't correct. */
    /* Most/all zip writers (hopefully) set DOS file/directory attributes in the low 16-bits, so check for the DOS directory flag and ignore the source OS ID in the created by field. */
    /* FIXME: Remove this check? Is it necessary - we already check the filename. */
    attribute_mapping_id = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_MADE_BY_OFS) >> 8;
    (void)attribute_mapping_id;

    external_attr = MZ_READ_LE32(p + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS);
    if ((external_attr & MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG) != 0)
    {
        return MZ_TRUE;
    }

    return MZ_FALSE;
}